

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_weakref(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType type;
  SQObjectPtr *pSVar1;
  SQWeakRef *x;
  SQObjectPtr local_20;
  
  pSVar1 = stack_get(v,idx);
  type = (pSVar1->super_SQObject)._type;
  if ((type >> 0x1b & 1) == 0) {
    local_20.super_SQObject._unVal = (pSVar1->super_SQObject)._unVal;
    local_20.super_SQObject._type = type;
    SQVM::Push(v,&local_20);
  }
  else {
    x = SQRefCounted::GetWeakRef((pSVar1->super_SQObject)._unVal.pRefCounted,type);
    SQObjectPtr::SQObjectPtr(&local_20,x);
    SQVM::Push(v,&local_20);
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return;
}

Assistant:

void sq_weakref(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    if(ISREFCOUNTED(type(o))) {
        v->Push(_refcounted(o)->GetWeakRef(type(o)));
        return;
    }
    v->Push(o);
}